

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::String>::truncate(ArrayBuilder<kj::String> *this,char *__file,__off_t __length)

{
  String *pSVar1;
  String *pSVar2;
  char *pcVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  
  pSVar1 = this->ptr;
  pSVar2 = this->pos;
  while (pSVar1 + (long)__file < pSVar2) {
    this->pos = pSVar2 + -1;
    pcVar3 = pSVar2[-1].content.ptr;
    if (pcVar3 != (char *)0x0) {
      sVar4 = pSVar2[-1].content.size_;
      pSVar2[-1].content.ptr = (char *)0x0;
      pSVar2[-1].content.size_ = 0;
      pAVar5 = pSVar2[-1].content.disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4,0);
    }
    pSVar2 = this->pos;
  }
  return (int)pSVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }